

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
          *field)

{
  ElemSegmentModuleField *pEVar1;
  _Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false> local_50;
  ElemSegment *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pEVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
           .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl;
  if (*(long *)(pEVar1 + 0x50) != 0) {
    local_48 = *(ElemSegment **)(pEVar1 + 0x18);
    uStack_40 = *(undefined4 *)(pEVar1 + 0x20);
    uStack_3c = *(undefined4 *)(pEVar1 + 0x24);
    local_38 = *(undefined4 *)(pEVar1 + 0x28);
    uStack_34 = *(undefined4 *)(pEVar1 + 0x2c);
    uStack_30 = *(undefined4 *)(pEVar1 + 0x30);
    uStack_2c = *(undefined4 *)(pEVar1 + 0x34);
    local_28 = (undefined4)
               ((ulong)(*(long *)&this->field_0x120 - *(long *)&this->elem_segments) >> 3);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->elem_segment_bindings,pEVar1 + 0x48);
  }
  local_48 = (ElemSegment *)(pEVar1 + 0x40);
  std::vector<wabt::ElemSegment*,std::allocator<wabt::ElemSegment*>>::
  emplace_back<wabt::ElemSegment*>
            ((vector<wabt::ElemSegment*,std::allocator<wabt::ElemSegment*>> *)&this->elem_segments,
             &local_48);
  local_50._M_head_impl =
       (field->_M_t).
       super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
       ._M_t.
       super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
       .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
  .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl =
       (ElemSegmentModuleField *)0x0;
  intrusive_list<wabt::ModuleField>::push_back
            (&this->fields,
             (unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)&local_50);
  if (local_50._M_head_impl != (ElemSegmentModuleField *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))();
  }
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<ElemSegmentModuleField> field) {
  ElemSegment& elem_segment = field->elem_segment;
  if (!elem_segment.name.empty()) {
    elem_segment_bindings.emplace(elem_segment.name,
                                  Binding(field->loc, elem_segments.size()));
  }
  elem_segments.push_back(&elem_segment);
  fields.push_back(std::move(field));
}